

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *table;
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *label;
  float row_min_height;
  float fStack_54;
  float fStack_44;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableHeadersRow() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0xb00,"void ImGui::TableHeadersRow()");
  }
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  IVar1 = GetCursorScreenPos();
  row_min_height = TableGetHeaderRowHeight();
  TableNextRow(1,row_min_height);
  if (table->HostSkipItems == false) {
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = GImGui->CurrentTable->ColumnsCount;
      if (0 < iVar5) {
        iVar6 = 0;
        do {
          bVar3 = TableSetColumnIndex(iVar6);
          if (bVar3) {
            uVar4 = TableGetColumnFlags(iVar6);
            label = "";
            if ((uVar4 >> 0xc & 1) == 0) {
              if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
                label = (char *)0x0;
              }
              else {
                label = TableGetColumnName(GImGui->CurrentTable,iVar6);
              }
            }
            PushID((int)table->InstanceCurrent * table->ColumnsCount + iVar6);
            TableHeader(label);
            PopID();
          }
          iVar6 = iVar6 + 1;
        } while (iVar5 != iVar6);
      }
    }
    IVar2 = GetMousePos();
    bVar3 = IsMouseReleased(1);
    if (bVar3) {
      if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
        iVar6 = -1;
      }
      else {
        iVar6 = (int)GImGui->CurrentTable->HoveredColumnBody;
      }
      if (iVar6 == iVar5) {
        fStack_44 = IVar1.y;
        fStack_54 = IVar2.y;
        if ((fStack_44 <= fStack_54) && (fStack_54 < fStack_44 + row_min_height)) {
          TableOpenContextMenu(-1);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}